

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyJson
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char c;
  char *__end2;
  char *__begin2;
  ArrayPtr<const_char> *local_38;
  ArrayPtr<const_char> *__range2;
  CompilerMain *pCStack_28;
  anon_enum_32 state;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  prefix_local.ptr = (uchar *)prefix.size_;
  this_local = (CompilerMain *)prefix.ptr;
  __range2._4_4_ = 0;
  pCStack_28 = this;
  ___begin2 = kj::ArrayPtr<const_unsigned_char>::asChars
                        ((ArrayPtr<const_unsigned_char> *)&this_local);
  local_38 = (ArrayPtr<const_char> *)&__begin2;
  __end2 = kj::ArrayPtr<const_char>::begin(local_38);
  pcVar3 = kj::ArrayPtr<const_char>::end(local_38);
  do {
    if (__end2 == pcVar3) {
      return PLAUSIBLE;
    }
    cVar1 = *__end2;
    if (__range2._4_4_ == 0) {
      iVar2 = (int)cVar1;
      if (((iVar2 - 9U < 3) || (iVar2 == 0xd)) || (iVar2 == 0x20)) goto LAB_0013e2f3;
      if (iVar2 == 0x23) {
        __range2._4_4_ = 1;
      }
      else if (iVar2 == 0x2f) {
        __range2._4_4_ = 1;
      }
      else {
        if (iVar2 != 0x7b) {
          return IMPOSSIBLE;
        }
        __range2._4_4_ = 2;
      }
    }
    else {
      if (__range2._4_4_ == 1) {
        if (cVar1 == '\n') {
          __range2._4_4_ = 0;
          goto LAB_0013e33d;
        }
      }
      else if ((__range2._4_4_ == 2) && (cVar1 == '\"')) {
        return PLAUSIBLE;
      }
LAB_0013e2f3:
      if (((('\0' < cVar1) && (cVar1 < ' ')) &&
          ((cVar1 != '\n' && (((cVar1 != '\r' && (cVar1 != '\t')) && (cVar1 != '\v')))))) ||
         (cVar1 == '\x7f')) {
        return IMPOSSIBLE;
      }
    }
LAB_0013e33d:
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

Plausibility isPlausiblyJson(kj::ArrayPtr<const byte> prefix) {
    enum { PREAMBLE, COMMENT, BODY } state = PREAMBLE;

    for (char c: prefix.asChars()) {
      switch (state) {
        case PREAMBLE:
          // Before opening parenthesis.
          switch (c) {
            case '{': state = BODY; continue;
            case '#': state = COMMENT; continue;
            case '/': state = COMMENT; continue;
            case ' ':
            case '\n':
            case '\r':
            case '\t':
            case '\v':
              // whitespace
              break;
            default:
              // Not whitespace, not comment, not open brace. Impossible!
              return IMPOSSIBLE;
          }
          break;
        case COMMENT:
          switch (c) {
            case '\n': state = PREAMBLE; continue;
            default: break;
          }
          break;
        case BODY:
          switch (c) {
            case '\"':
              // String literal. Let's stop here before things get complicated.
              return PLAUSIBLE;
            default:
              break;
          }
          break;
      }

      if ((c > 0 && c < ' ' && c != '\n' && c != '\r' && c != '\t' && c != '\v') || c == 0x7f) {
        // Unprintable character.
        return IMPOSSIBLE;
      }
    }

    return PLAUSIBLE;
  }